

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonRewrite.c
# Opt level: O1

_Bool ParseCommandLineBoolArg(int *pArgC,char ***pArgV,char *String1,char *String2)

{
  char *__s2;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  _Bool _Var5;
  
  uVar3 = *pArgC;
  if ((int)uVar3 < 1) {
    _Var5 = false;
  }
  else {
    uVar4 = 0;
    _Var5 = false;
    do {
      __s2 = (*pArgV)[uVar4];
      iVar1 = strcasecmp(String1,__s2);
      if ((iVar1 == 0) || (iVar1 = strcasecmp(String2,__s2), iVar1 == 0)) {
        uVar3 = uVar3 - 1;
        if ((long)uVar4 < (long)(int)uVar3) {
          uVar2 = uVar4;
          do {
            (*pArgV)[uVar2] = (*pArgV)[uVar2 + 1];
            uVar2 = uVar2 + 1;
          } while (uVar3 != uVar2);
        }
        *pArgC = uVar3;
        _Var5 = true;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)(int)uVar3);
  }
  return _Var5;
}

Assistant:

static
bool
    ParseCommandLineBoolArg
    (
        int*        pArgC,      // [in,out]
        char***     pArgV,      // [in,out]
        char const* String1,    // [in]
        char const* String2     // [in]
    )
{
    bool itemExists = false;

    for( int i=0; i<*pArgC; i++ )
    {
        if(     strcasecmp( String1, (*pArgV)[i] ) == 0
            ||  strcasecmp( String2, (*pArgV)[i] ) == 0 )
        {
            itemExists = true;
            // ripple down remaining items
            for( int x=i; x<(*pArgC)-1; x++ )
            {
                (*pArgV)[x] = (*pArgV)[x+1];
            }
            *pArgC -= 1;
        }
    }

    return itemExists;
}